

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall kj::_::ForkHubBase::traceEvent(ForkHubBase *this,TraceBuilder *builder)

{
  PromiseNode *pPVar1;
  
  pPVar1 = (this->inner).ptr;
  if (pPVar1 != (PromiseNode *)0x0) {
    (*(pPVar1->super_PromiseArenaMember)._vptr_PromiseArenaMember[4])(pPVar1,builder,1);
  }
  if (this->headBranch != (ForkBranchBase *)0x0) {
    PromiseNode::OnReadyEvent::traceEvent(&this->headBranch->onReadyEvent,builder);
    return;
  }
  return;
}

Assistant:

void ForkHubBase::traceEvent(TraceBuilder& builder) {
  if (inner.get() != nullptr) {
    inner->tracePromise(builder, true);
  }

  if (headBranch != nullptr) {
    // We'll trace down the first branch, I guess.
    headBranch->onReadyEvent.traceEvent(builder);
  }
}